

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex_interface.cpp
# Opt level: O1

void SoPlex_getRowVectorRational
               (void *soplex,int i,int *nnonzeros,long *indices,long *coefsnum,long *coefsdenom)

{
  uint uVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar2;
  ulong *puVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  LPRowRational lprow;
  data_type local_178;
  uint local_168;
  undefined1 local_164;
  byte local_163;
  byte local_162;
  long local_150;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_148;
  int *local_138;
  long *local_130;
  long *local_128;
  long *local_120;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  local_118;
  
  local_138 = nnonzeros;
  local_130 = indices;
  local_128 = coefsdenom;
  local_120 = coefsnum;
  ::soplex::
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase(&local_118,0);
  local_148.m_elem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        *)0x0;
  local_148.memsize = 0;
  local_148.memused = 0;
  ::soplex::
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::getRow(*(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             **)((long)soplex + 0x45c0),i,&local_118);
  ::soplex::
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::operator=(&local_148,
              &local_118.vec.
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             );
  *local_138 = local_148.memused;
  if (0 < local_148.memused) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pNVar2 = local_148.m_elem;
      puVar3 = (ulong *)((long)&((local_148.m_elem)->val).m_backend.m_value.num.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar5);
      local_178.la[0] = 0;
      local_162 = *(byte *)((long)&((local_148.m_elem)->val).m_backend.m_value.num.m_backend.
                                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   .m_alias + lVar5);
      uVar1 = *(uint *)((long)&((local_148.m_elem)->val).m_backend.m_value.num.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_limbs + lVar5);
      local_168 = 0;
      if (local_162 != 0) {
        local_168 = uVar1;
      }
      local_164 = *(undefined1 *)
                   ((long)&((local_148.m_elem)->val).m_backend.m_value.num.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_sign + lVar5);
      local_163 = local_162 ^ 1;
      if (local_162 == 1) {
        local_178.la[0] = *puVar3;
        local_178.ld.data = (limb_pointer)puVar3[1];
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_178.ld,uVar1,uVar1);
        uVar4 = &local_178;
        if (local_163 == 0) {
          uVar4 = local_178.ld.data;
        }
        if (*(char *)((long)&(pNVar2->val).m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_internal + lVar5) == '\0') {
          puVar3 = *(ulong **)
                    ((long)&(pNVar2->val).m_backend.m_value.num.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar5 + 8);
        }
        memcpy((void *)uVar4,puVar3,
               (ulong)*(uint *)((long)&(pNVar2->val).m_backend.m_value.num.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_limbs + lVar5) << 3);
      }
      local_150 = 0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::convert_to_imp<long>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_178.ld,&local_150);
      local_120[lVar6] = local_150;
      if ((local_163 == 0) && (local_162 == 0)) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      pNVar2 = local_148.m_elem;
      puVar3 = (ulong *)((long)&((local_148.m_elem)->val).m_backend.m_value.den.m_backend.
                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                .m_data + lVar5);
      local_178.la[0] = 0;
      local_162 = *(byte *)((long)&((local_148.m_elem)->val).m_backend.m_value.den.m_backend.
                                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   .m_alias + lVar5);
      uVar1 = *(uint *)((long)&((local_148.m_elem)->val).m_backend.m_value.den.m_backend.
                               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               .m_limbs + lVar5);
      local_168 = 0;
      if (local_162 != 0) {
        local_168 = uVar1;
      }
      local_164 = *(undefined1 *)
                   ((long)&((local_148.m_elem)->val).m_backend.m_value.den.m_backend.
                           super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                           .m_sign + lVar5);
      local_163 = local_162 ^ 1;
      if (local_162 == 1) {
        local_178.la[0] = *puVar3;
        local_178.ld.data =
             (limb_pointer)
             *(undefined8 *)
              ((long)&((local_148.m_elem)->val).m_backend.m_value.den.m_backend.
                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      .m_data + lVar5 + 8);
      }
      else {
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_178.ld,uVar1,uVar1);
        uVar4 = &local_178;
        if (local_163 == 0) {
          uVar4 = local_178.ld.data;
        }
        if (*(char *)((long)&(pNVar2->val).m_backend.m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_internal + lVar5) == '\0') {
          puVar3 = *(ulong **)
                    ((long)&(pNVar2->val).m_backend.m_value.den.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data + lVar5 + 8);
        }
        memcpy((void *)uVar4,puVar3,
               (ulong)*(uint *)((long)&(pNVar2->val).m_backend.m_value.den.m_backend.
                                       super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                       .m_limbs + lVar5) << 3);
      }
      local_150 = 0;
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::convert_to_imp<long>
                ((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_178.ld,&local_150);
      local_128[lVar6] = local_150;
      if ((local_163 == 0) && (local_162 == 0)) {
        operator_delete(local_178.ld.data,(local_178.la[0] & 0xffffffff) << 3);
      }
      local_130[lVar6] = (long)*(int *)((long)&(local_148.m_elem)->idx + lVar5);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x50;
    } while (lVar6 < *local_138);
  }
  ::soplex::
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~LPRowBase(&local_118);
  return;
}

Assistant:

void SoPlex_getRowVectorRational(void* soplex, int i, int* nnonzeros, long* indices, long* coefsnum,
                                 long* coefsdenom)
{
#ifndef SOPLEX_WITH_BOOST
   throw SPxException("Rational functions cannot be used when built without Boost.");
#else
   SoPlex* so = (SoPlex*)(soplex);
   LPRowRational lprow;
   SVectorRational row;

   so->getRowRational(i, lprow);
   row = lprow.rowVector();

   *nnonzeros = row.size();

   for(int j = 0; j < *nnonzeros; ++j)
   {
      coefsnum[j] = (long int) numerator(row.value(j));
      coefsdenom[j] = (long int) denominator(row.value(j));
      indices[j] = row.index(j);
   }

#endif
}